

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

NodeTraversalSignal FindDescendant_cb(TidyDocImpl *doc,Node *node,void *propagate)

{
  int iVar1;
  TidyTagId local_34;
  MatchingDescendantData *cb_data;
  void *propagate_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) {
    local_34 = TidyTag_UNKNOWN;
  }
  else {
    local_34 = node->tag->id;
  }
  if ((local_34 == *(TidyTagId *)((long)propagate + 0x10)) &&
     ((*(int *)((long)propagate + 0x10) != 0 ||
      ((((node->element != (tmbstr)0x0 && (*(long *)((long)propagate + 0x18) != 0)) &&
        (*(long *)(*(long *)((long)propagate + 0x18) + 0x40) != 0)) &&
       (iVar1 = prvTidytmbstrcmp(*(ctmbstr *)(*(long *)((long)propagate + 0x18) + 0x40),
                                 node->element), iVar1 == 0)))))) {
    *(Node **)propagate = node;
    doc_local._4_4_ = ExitTraversal;
  }
  else {
    if ((*(long *)((long)propagate + 8) != 0) && (node == *(Node **)((long)propagate + 0x20))) {
      **(undefined4 **)((long)propagate + 8) = 1;
    }
    doc_local._4_4_ = VisitParent;
  }
  return doc_local._4_4_;
}

Assistant:

static NodeTraversalSignal FindDescendant_cb(TidyDocImpl* ARG_UNUSED(doc), Node* node, void *propagate)
{
    struct MatchingDescendantData *cb_data = (struct MatchingDescendantData *)propagate;

    if (TagId(node) == cb_data->matching_tagId)
    {
        /* make sure we match up 'unknown' tags exactly! */
        if (cb_data->matching_tagId != TidyTag_UNKNOWN ||
            (node->element != NULL &&
            cb_data->node_to_find != NULL &&
            cb_data->node_to_find->element != NULL &&
            0 == TY_(tmbstrcmp)(cb_data->node_to_find->element, node->element)))
        {
            cb_data->found_node = node;
            return ExitTraversal;
        }
    }

    if (cb_data->passed_marker_node && node == cb_data->marker_node)
        *cb_data->passed_marker_node = yes;

    return VisitParent;
}